

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaJf.c
# Opt level: O2

void Jf_ManComputeCuts(Jf_Man_t *p,int fEdge)

{
  uint uVar1;
  uint uVar2;
  Gia_Man_t *pGVar3;
  Jf_Par_t *pJVar4;
  int iVar5;
  int iVar6;
  Gia_Obj_t *pObj;
  abctime aVar7;
  long lVar8;
  long lVar9;
  int fReverse;
  abctime time;
  char *pStr;
  int v;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  int local_3c [3];
  
  if (p->pPars->fVerbose != 0) {
    pGVar3 = p->pGia;
    uVar1 = pGVar3->vCis->nSize;
    uVar2 = pGVar3->vCos->nSize;
    printf("Aig: CI = %d  CO = %d  AND = %d    ",(ulong)uVar1,(ulong)uVar2,
           (ulong)(~(uVar2 + uVar1) + pGVar3->nObjs));
    pJVar4 = p->pPars;
    printf("LutSize = %d  CutMax = %d  Rounds = %d\n",(ulong)(uint)pJVar4->nLutSize,
           (ulong)(uint)pJVar4->nCutNum,(ulong)(uint)pJVar4->nRounds);
    printf("Computing cuts...\r");
    fflush(_stdout);
  }
  for (v = 0; v < p->pGia->nObjs; v = v + 1) {
    pObj = Gia_ManObj(p->pGia,v);
    if (pObj == (Gia_Obj_t *)0x0) break;
    if (((undefined1  [12])*pObj & (undefined1  [12])0x9fffffff) == (undefined1  [12])0x9fffffff) {
LAB_005e624b:
      iVar5 = Gia_ObjId(p->pGia,pObj);
      local_3c[0] = 1;
      local_3c[1] = 0x201;
      local_3c[2] = Abc_Var2Lit(iVar5,0);
      if (((undefined1  [12])*pObj & (undefined1  [12])0x9fffffff) != (undefined1  [12])0x9fffffff)
      {
        iVar6 = Gia_ObjIsBuf(pObj);
        if (iVar6 == 0) goto LAB_005e64a0;
      }
      iVar6 = Vec_SetAppend(&p->pMem,local_3c,3);
      Vec_IntWriteEntry(&p->vCuts,iVar5,iVar6);
    }
    else {
      iVar5 = Gia_ObjIsBuf(pObj);
      if (iVar5 != 0) goto LAB_005e624b;
    }
    iVar5 = Gia_ObjIsBuf(pObj);
    if (iVar5 != 0) {
      Jf_ObjPropagateBuf(p,pObj,fReverse);
LAB_005e64a0:
      __assert_fail("Gia_ObjIsCi(pObj) || Gia_ObjIsBuf(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaJf.c"
                    ,0x451,"void Jf_ObjAssignCut(Jf_Man_t *, Gia_Obj_t *)");
    }
    if ((~*(uint *)pObj & 0x1fffffff) != 0 && -1 < (int)*(uint *)pObj) {
      Jf_ObjComputeCuts(p,pObj,fEdge);
    }
  }
  if (p->pPars->fVerbose != 0) {
    printf("CutPair = %lu  ",p->CutCount[0]);
    printf("Merge = %lu  ",p->CutCount[1]);
    printf("Eval = %lu  ",p->CutCount[2]);
    pStr = (char *)p->CutCount[3];
    printf("Cut = %lu  ");
    aVar7 = Abc_Clock();
    Abc_PrintTime((int)aVar7 - (int)p->clkStart,pStr,time);
    printf("Memory:  ");
    dVar10 = Gia_ManMemory(p->pGia);
    printf("Gia = %.2f MB  ",dVar10 * 9.5367431640625e-07);
    printf("Man = %.2f MB  ",(double)p->pGia->nObjs * 24.0 * 9.5367431640625e-07);
    lVar8 = (long)(p->pMem).nPagesAlloc << 3;
    auVar11._8_4_ = (int)((ulong)lVar8 >> 0x20);
    auVar11._0_8_ = lVar8;
    auVar11._12_4_ = 0x45300000;
    lVar9 = ((long)(p->pMem).iPage + 1) * (8L << ((byte)(p->pMem).nPageSize & 0x3f));
    auVar12._8_4_ = (int)((ulong)lVar9 >> 0x20);
    auVar12._0_8_ = lVar9;
    auVar12._12_4_ = 0x45300000;
    printf("Cuts = %.2f MB",
           ((auVar12._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)lVar9) - 4503599627370496.0) +
           (auVar11._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0) + 32.0) *
           9.5367431640625e-07);
    if (p->nCoarse != 0) {
      printf("   Coarse = %d (%.1f %%)",((double)p->nCoarse * 100.0) / (double)p->pGia->nObjs);
    }
    putchar(10);
    fflush(_stdout);
  }
  return;
}

Assistant:

void Jf_ManComputeCuts( Jf_Man_t * p, int fEdge )
{
    Gia_Obj_t * pObj; int i;
    if ( p->pPars->fVerbose )
    {
        printf( "Aig: CI = %d  CO = %d  AND = %d    ", Gia_ManCiNum(p->pGia), Gia_ManCoNum(p->pGia), Gia_ManAndNum(p->pGia) );
        printf( "LutSize = %d  CutMax = %d  Rounds = %d\n", p->pPars->nLutSize, p->pPars->nCutNum, p->pPars->nRounds );
        printf( "Computing cuts...\r" );
        fflush( stdout );
    }
    Gia_ManForEachObj( p->pGia, pObj, i )
    {
        if ( Gia_ObjIsCi(pObj) || Gia_ObjIsBuf(pObj) )
            Jf_ObjAssignCut( p, pObj );
        if ( Gia_ObjIsBuf(pObj) )
            Jf_ObjPropagateBuf( p, pObj, 0 );
        else if ( Gia_ObjIsAnd(pObj) )
            Jf_ObjComputeCuts( p, pObj, fEdge );
    }
    if ( p->pPars->fVerbose )
    {
        printf( "CutPair = %lu  ", (long)p->CutCount[0] );
        printf( "Merge = %lu  ",   (long)p->CutCount[1] );
        printf( "Eval = %lu  ",    (long)p->CutCount[2] );
        printf( "Cut = %lu  ",     (long)p->CutCount[3] );
        Abc_PrintTime( 1, "Time",  Abc_Clock() - p->clkStart );
        printf( "Memory:  " );
        printf( "Gia = %.2f MB  ", Gia_ManMemory(p->pGia) / (1<<20) );
        printf( "Man = %.2f MB  ", 6.0 * sizeof(int) * Gia_ManObjNum(p->pGia) / (1<<20) );
        printf( "Cuts = %.2f MB",  Vec_ReportMemory(&p->pMem) / (1<<20) );
        if ( p->nCoarse )
        printf( "   Coarse = %d (%.1f %%)",  p->nCoarse, 100.0 * p->nCoarse / Gia_ManObjNum(p->pGia) );
        printf( "\n" );
        fflush( stdout );
    }
}